

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INumberReader.cpp
# Opt level: O0

void __thiscall INumberReader::getWord(INumberReader *this,string *str)

{
  bool bVar1;
  string local_a0 [32];
  string local_80 [36];
  int local_5c;
  int local_58;
  int i;
  int maxLen;
  char local_41;
  string local_40 [7];
  char tempChar;
  string tempStr;
  INumberJudger local_19;
  string *psStack_18;
  INumberJudger iNumberJudger;
  string *str_local;
  INumberReader *this_local;
  
  psStack_18 = str;
  std::__cxx11::string::string(local_40);
  while ((local_41 = std::istream::get(), local_41 != -1 &&
         (bVar1 = IDictionary::isRealNumberContext(local_41), bVar1))) {
    std::__cxx11::string::operator+=(local_40,local_41);
  }
  local_58 = std::__cxx11::string::length();
  for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_40);
    std::__cxx11::string::operator=((string *)psStack_18,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::string(local_a0,(string *)psStack_18);
    bVar1 = INumberJudger::isNumber(&local_19,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    if (bVar1) break;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void INumberReader::getWord(std::string &str) {
    INumberJudger iNumberJudger;
    std::string tempStr;
    char tempChar;
    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isRealNumberContext(tempChar))
        {
            tempStr+=tempChar;
        }
        else
        {
            break;
        }
    }
    int maxLen=tempStr.length();
    for(int i=0;i<maxLen;i++)
    {
        str=tempStr.substr(0,maxLen-i);
        if(iNumberJudger.isNumber(str))
        {
            break;
        }
    }
}